

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O0

void __thiscall QTextHtmlParser::dumpHtml(QTextHtmlParser *this)

{
  int iVar1;
  QTextHtmlParserNode *s;
  long in_FS_OFFSET;
  int i;
  char *in_stack_ffffffffffffff28;
  QTextHtmlParser *in_stack_ffffffffffffff30;
  int line;
  QString *in_stack_ffffffffffffff38;
  QMessageLogger *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int iVar2;
  int local_a4;
  char *in_stack_ffffffffffffff78;
  QChar local_62;
  QString local_60 [3];
  QDebug local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_a4 = 0;
  while( true ) {
    line = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    iVar2 = local_a4;
    iVar1 = count((QTextHtmlParser *)0x859895);
    if (iVar1 <= iVar2) break;
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,line,
               in_stack_ffffffffffffff28);
    iVar1 = (int)((ulong)in_stack_ffffffffffffff28 >> 0x20);
    QMessageLogger::debug();
    in_stack_ffffffffffffff30 = (QTextHtmlParser *)QDebug::nospace(&local_10);
    iVar1 = depth(in_stack_ffffffffffffff30,iVar1);
    in_stack_ffffffffffffff28 = (char *)(long)(iVar1 << 2);
    QChar::QChar<char16_t,_true>(&local_62,L' ');
    QString::QString(local_60,(longlong)in_stack_ffffffffffffff28,local_62);
    QtPrivate::asString(local_60);
    QString::toLocal8Bit((QString *)CONCAT44(iVar2,in_stack_ffffffffffffff48));
    QByteArray::constData((QByteArray *)0x859940);
    in_stack_ffffffffffffff38 =
         (QString *)
         QDebug::operator<<((QDebug *)CONCAT44(iVar2,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff78);
    s = at(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    QtPrivate::asString(&s->tag);
    QString::toLocal8Bit((QString *)CONCAT44(iVar2,in_stack_ffffffffffffff48));
    QByteArray::constData((QByteArray *)0x85997f);
    QDebug::operator<<((QDebug *)CONCAT44(iVar2,in_stack_ffffffffffffff48),in_stack_ffffffffffffff78
                      );
    in_stack_ffffffffffffff40 =
         (QMessageLogger *)
         QDebug::operator<<((QDebug *)in_stack_ffffffffffffff30,
                            (char)((ulong)in_stack_ffffffffffffff28 >> 0x38));
    at(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
    quoteNewline((QString *)CONCAT44(iVar2,in_stack_ffffffffffffff48));
    QDebug::operator<<((QDebug *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    QString::~QString((QString *)0x8599d6);
    QByteArray::~QByteArray((QByteArray *)0x8599e0);
    QByteArray::~QByteArray((QByteArray *)0x8599ed);
    QString::~QString((QString *)0x8599f7);
    QDebug::~QDebug(&local_10);
    local_a4 = local_a4 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParser::dumpHtml()
{
    for (int i = 0; i < count(); ++i) {
        qDebug().nospace() << qPrintable(QString(depth(i) * 4, u' '))
                           << qPrintable(at(i).tag) << ':'
                           << quoteNewline(at(i).text);
    }
}